

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptSelectionStatement
          (HlslGrammar *this,TIntermNode **statement,TAttributes *attributes)

{
  int *piVar1;
  TIntermNodePair nodePair;
  bool bVar2;
  int iVar3;
  TIntermSelection *pTVar4;
  undefined4 extraout_var;
  char *pcVar5;
  HlslParseContext *pHVar6;
  _func_int **pp_Var7;
  TIntermTyped *condition;
  TIntermNodePair thenElse;
  TSourceLoc loc;
  TIntermTyped *local_50;
  TIntermNode *local_48;
  TIntermNode *pTStack_40;
  TSourceLoc local_38;
  
  local_38.column = (this->super_HlslTokenStream).token.loc.column;
  local_38._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
  local_38.name = (this->super_HlslTokenStream).token.loc.name;
  local_38.string = (this->super_HlslTokenStream).token.loc.string;
  local_38.line = (this->super_HlslTokenStream).token.loc.line;
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokIf);
  if (bVar2) {
    TSymbolTable::push((this->parseContext->super_TParseContextBase).symbolTable);
    bVar2 = acceptParenExpression(this,&local_50);
    if ((bVar2) &&
       (local_50 = HlslParseContext::convertConditionalExpression
                             (this->parseContext,&local_38,local_50,true),
       local_50 != (TIntermTyped *)0x0)) {
      local_48 = (TIntermNode *)0x0;
      pTStack_40 = (TIntermNode *)0x0;
      piVar1 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
      *piVar1 = *piVar1 + 1;
      bVar2 = acceptScopedStatement(this,&local_48);
      if (bVar2) {
        bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokElse);
        if ((!bVar2) || (bVar2 = acceptScopedStatement(this,&pTStack_40), bVar2)) {
          nodePair.node2 = pTStack_40;
          nodePair.node1 = local_48;
          pTVar4 = TIntermediate::addSelection(this->intermediate,local_50,nodePair,&local_38);
          *statement = (TIntermNode *)pTVar4;
          pHVar6 = this->parseContext;
          iVar3 = (*(pTVar4->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[9])(pTVar4);
          HlslParseContext::handleSelectionAttributes
                    (pHVar6,&local_38,(TIntermSelection *)CONCAT44(extraout_var,iVar3),attributes);
          TSymbolTable::pop((this->parseContext->super_TParseContextBase).symbolTable,
                            (TPrecisionQualifier *)0x0);
          piVar1 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
          *piVar1 = *piVar1 + -1;
          return true;
        }
        pHVar6 = this->parseContext;
        pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar5 = "else statement";
      }
      else {
        pHVar6 = this->parseContext;
        pp_Var7 = (pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar5 = "then statement";
      }
      (*pp_Var7[0x2d])(pHVar6,&(this->super_HlslTokenStream).token,"Expected",pcVar5,"");
      return false;
    }
  }
  return false;
}

Assistant:

bool HlslGrammar::acceptSelectionStatement(TIntermNode*& statement, const TAttributes& attributes)
{
    TSourceLoc loc = token.loc;

    // IF
    if (! acceptTokenClass(EHTokIf))
        return false;

    // so that something declared in the condition is scoped to the lifetimes
    // of the then-else statements
    parseContext.pushScope();

    // LEFT_PAREN expression RIGHT_PAREN
    TIntermTyped* condition;
    if (! acceptParenExpression(condition))
        return false;
    condition = parseContext.convertConditionalExpression(loc, condition);
    if (condition == nullptr)
        return false;

    // create the child statements
    TIntermNodePair thenElse = { nullptr, nullptr };

    ++parseContext.controlFlowNestingLevel;  // this only needs to work right if no errors

    // then statement
    if (! acceptScopedStatement(thenElse.node1)) {
        expected("then statement");
        return false;
    }

    // ELSE
    if (acceptTokenClass(EHTokElse)) {
        // else statement
        if (! acceptScopedStatement(thenElse.node2)) {
            expected("else statement");
            return false;
        }
    }

    // Put the pieces together
    statement = intermediate.addSelection(condition, thenElse, loc);
    parseContext.handleSelectionAttributes(loc, statement->getAsSelectionNode(), attributes);

    parseContext.popScope();
    --parseContext.controlFlowNestingLevel;

    return true;
}